

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O1

ByteData *
cfd::core::ConvertBitcoinTxFromWally
          (ByteData *__return_storage_ptr__,wally_tx *tx,bool force_exclude_witness)

{
  wally_tx_witness_stack *pwVar1;
  wally_tx_output *pwVar2;
  wally_tx_witness_item *pwVar3;
  bool bVar4;
  void *pvVar5;
  int iVar6;
  ulong uVar7;
  CfdException *pCVar8;
  size_t *psVar9;
  ulong uVar10;
  uint32_t initial_size;
  long lVar11;
  uint uVar12;
  size_t sVar13;
  ulong uVar14;
  wally_tx_input *pwVar15;
  wally_tx *pwVar16;
  byte bVar17;
  int ret;
  Serializer builder;
  size_t size;
  size_t tx_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t witness_count;
  int local_9c;
  Serializer local_98;
  size_t local_70;
  wally_tx *local_68;
  size_t local_60;
  uchar *local_58;
  long local_50;
  long local_48;
  ByteData *local_40;
  size_t local_38;
  
  local_38 = 0;
  local_9c = wally_tx_get_witness_count(tx,&local_38);
  if (local_9c != 0) {
    local_98._vptr_Serializer = (_func_int **)0x62240e;
    local_98.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x3cc;
    local_98.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "ConvertBitcoinTxFromWally";
    logger::log<int&>((CfdSourceLocation *)&local_98,kCfdLogLevelWarning,
                      "wally_tx_get_witness_count NG[{}]",&local_9c);
    pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98._vptr_Serializer =
         (_func_int **)
         &local_98.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"psbt witness count get error.","");
    CfdException::CfdException(pCVar8,kCfdIllegalStateError,(string *)&local_98);
    __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar17 = ~force_exclude_witness & local_38 != 0;
  local_70 = 0;
  local_9c = wally_tx_get_length(tx,(uint)bVar17,&local_70);
  if (local_9c == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,local_70,
               (allocator_type *)&local_98);
    local_60 = 0;
    iVar6 = -2;
    if (0x13 < local_70) {
      iVar6 = wally_tx_to_bytes(tx,(uint)bVar17,local_58,local_50 - (long)local_58,&local_60);
    }
    local_9c = iVar6;
    if (iVar6 == -2) {
      if ((tx->num_inputs != 0) && (tx->num_outputs != 0)) {
        local_98._vptr_Serializer = (_func_int **)0x62240e;
        local_98.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x435;
        local_98.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "ConvertBitcoinTxFromWally";
        logger::log<int&>((CfdSourceLocation *)&local_98,kCfdLogLevelWarning,
                          "wally_tx_to_bytes NG[{}].",&local_9c);
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        local_98._vptr_Serializer =
             (_func_int **)
             &local_98.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"tx hex convert error.","");
        CfdException::CfdException(pCVar8,kCfdIllegalStateError,(string *)&local_98);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_98._vptr_Serializer = (_func_int **)0x62240e;
      local_98.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x3ed;
      local_98.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "ConvertBitcoinTxFromWally";
      logger::log<unsigned_long&>
                ((CfdSourceLocation *)&local_98,kCfdLogLevelInfo,"wally_tx_get_length size[{}]",
                 &local_70);
      uVar7 = tx->num_inputs;
      uVar10 = tx->num_outputs;
      lVar11 = uVar10 * 0x70 + uVar7 * 0xd0 + 0x38;
      if (uVar7 != 0) {
        psVar9 = &tx->inputs->script_len;
        uVar12 = 1;
        do {
          lVar11 = lVar11 + *psVar9 + 10;
          uVar14 = (ulong)uVar12;
          psVar9 = psVar9 + 0x1a;
          uVar12 = uVar12 + 1;
        } while (uVar14 < uVar7);
      }
      if (uVar10 != 0) {
        psVar9 = &tx->outputs->script_len;
        uVar12 = 1;
        do {
          lVar11 = lVar11 + *psVar9 + 10;
          uVar14 = (ulong)uVar12;
          psVar9 = psVar9 + 0xe;
          uVar12 = uVar12 + 1;
        } while (uVar14 < uVar10);
      }
      initial_size = (uint32_t)lVar11;
      if (uVar7 != 0 && bVar17 == 1) {
        uVar10 = 0;
        do {
          pwVar1 = tx->inputs[uVar10].witness;
          if (pwVar1 == (wally_tx_witness_stack *)0x0) {
            sVar13 = 0;
          }
          else {
            sVar13 = pwVar1->num_items;
          }
          if (sVar13 != 0) {
            psVar9 = &pwVar1->items->witness_len;
            uVar12 = 1;
            do {
              lVar11 = lVar11 + *psVar9 + 10;
              uVar14 = (ulong)uVar12;
              psVar9 = psVar9 + 2;
              uVar12 = uVar12 + 1;
            } while (uVar14 < sVar13);
          }
          lVar11 = lVar11 + 10;
          initial_size = (uint32_t)lVar11;
          uVar10 = uVar10 + 1;
        } while ((uVar10 & 0xffffffff) < uVar7);
      }
      Serializer::Serializer(&local_98,initial_size);
      Serializer::AddDirectNumber(&local_98,tx->version);
      if ((bVar17 != 0) && (tx->num_inputs != 0)) {
        Serializer::AddDirectByte(&local_98,'\0');
        Serializer::AddDirectByte(&local_98,'\x01');
      }
      Serializer::AddVariableInt(&local_98,tx->num_inputs);
      if (tx->num_inputs != 0) {
        uVar7 = 0;
        uVar10 = 1;
        do {
          pwVar15 = tx->inputs + uVar7;
          Serializer::AddDirectBytes(&local_98,pwVar15->txhash,0x20);
          Serializer::AddDirectNumber(&local_98,pwVar15->index);
          Serializer::AddVariableBuffer(&local_98,pwVar15->script,(uint32_t)pwVar15->script_len);
          Serializer::AddDirectNumber(&local_98,pwVar15->sequence);
          bVar4 = uVar10 < tx->num_inputs;
          uVar7 = uVar10;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (bVar4);
      }
      Serializer::AddVariableInt(&local_98,tx->num_outputs);
      local_68 = tx;
      local_40 = __return_storage_ptr__;
      if (tx->num_outputs != 0) {
        uVar7 = 0;
        uVar10 = 1;
        do {
          pwVar2 = local_68->outputs;
          Serializer::AddDirectNumber(&local_98,pwVar2[uVar7].satoshi);
          Serializer::AddVariableBuffer
                    (&local_98,pwVar2[uVar7].script,(uint32_t)pwVar2[uVar7].script_len);
          bVar4 = uVar10 < local_68->num_outputs;
          uVar7 = uVar10;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (bVar4);
      }
      pwVar16 = local_68;
      if ((bVar17 != 0) && (local_68->num_inputs != 0)) {
        uVar7 = 0;
        do {
          pwVar15 = pwVar16->inputs;
          pwVar1 = pwVar15[uVar7].witness;
          uVar12 = 0;
          if (pwVar1 != (wally_tx_witness_stack *)0x0) {
            uVar12 = (uint)pwVar1->num_items;
          }
          Serializer::AddVariableInt(&local_98,(ulong)uVar12);
          pwVar16 = local_68;
          if (uVar12 != 0) {
            lVar11 = 0;
            do {
              pwVar3 = (pwVar15[uVar7].witness)->items;
              Serializer::AddVariableBuffer
                        (&local_98,*(uint8_t **)((long)&pwVar3->witness + lVar11),
                         *(uint32_t *)((long)&pwVar3->witness_len + lVar11));
              lVar11 = lVar11 + 0x10;
            } while ((ulong)uVar12 << 4 != lVar11);
          }
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (uVar7 < pwVar16->num_inputs);
      }
      Serializer::AddDirectNumber(&local_98,pwVar16->locktime);
      __return_storage_ptr__ = local_40;
      Serializer::Output(local_40,&local_98);
      local_98._vptr_Serializer = (_func_int **)&PTR__Serializer_00887f98;
      pvVar5 = (void *)CONCAT44(local_98.buffer_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_98.buffer_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,(long)local_98.buffer_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar5);
      }
    }
    else {
      if (iVar6 != 0) {
        local_98._vptr_Serializer = (_func_int **)0x62240e;
        local_98.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x439;
        local_98.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "ConvertBitcoinTxFromWally";
        logger::log<int&>((CfdSourceLocation *)&local_98,kCfdLogLevelWarning,
                          "wally_tx_to_bytes NG[{}].",&local_9c);
        pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
        local_98._vptr_Serializer =
             (_func_int **)
             &local_98.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"psbt tx hex convert error.","");
        CfdException::CfdException(pCVar8,kCfdIllegalStateError,(string *)&local_98);
        __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ByteData::ByteData(__return_storage_ptr__,local_58,(uint32_t)local_60);
    }
    if (local_58 != (uint8_t *)0x0) {
      operator_delete(local_58,local_48 - (long)local_58);
    }
    return __return_storage_ptr__;
  }
  local_98._vptr_Serializer = (_func_int **)0x62240e;
  local_98.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x3d6;
  local_98.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "ConvertBitcoinTxFromWally";
  logger::log<int&>((CfdSourceLocation *)&local_98,kCfdLogLevelWarning,"wally_tx_get_length NG[{}]",
                    &local_9c);
  pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
  local_98._vptr_Serializer =
       (_func_int **)
       &local_98.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"psbt tx size get error.","");
  CfdException::CfdException(pCVar8,kCfdIllegalStateError,(string *)&local_98);
  __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData ConvertBitcoinTxFromWally(
    const struct wally_tx *tx, bool force_exclude_witness) {
  int ret;
  size_t witness_count = 0;
  ret = wally_tx_get_witness_count(tx, &witness_count);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_witness_count NG[{}]", ret);
    throw CfdException(kCfdIllegalStateError, "psbt witness count get error.");
  }

  uint32_t flags = (witness_count != 0) ? WALLY_TX_FLAG_USE_WITNESS : 0;
  if (force_exclude_witness) flags = 0;

  size_t size = 0;
  ret = wally_tx_get_length(tx, flags, &size);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_length NG[{}]", ret);
    throw CfdException(kCfdIllegalStateError, "psbt tx size get error.");
  }

  try {
    std::vector<uint8_t> buf(size);
    size_t tx_size = 0;

    if (size < kTransactionMinimumHexSize) {
      ret = WALLY_EINVAL;
    } else {
      ret = wally_tx_to_bytes(tx, flags, buf.data(), buf.size(), &tx_size);
    }

    if (ret == WALLY_OK) {
      return ByteData(buf.data(), static_cast<uint32_t>(tx_size));
    } else if (ret == WALLY_EINVAL) {
      /* TODO: About conversion to the object.
      * In libwally, txin / txout does not allow empty data.
      * Therefore, if txin / txout is empty, object to byte is an error.
      * Therefore, it performs its own processing under certain circumstances.
      */
      if ((tx->num_inputs == 0) || (tx->num_outputs == 0)) {
        info(CFD_LOG_SOURCE, "wally_tx_get_length size[{}]", size);
        // Necessary size calculation because wally_tx_get_length may be
        // an invalid value (reserved more)
        size_t need_size = sizeof(struct wally_tx);
        need_size += tx->num_inputs * sizeof(struct wally_tx_input);
        need_size += tx->num_outputs * sizeof(struct wally_tx_output);
        for (uint32_t i = 0; i < tx->num_inputs; ++i) {
          const struct wally_tx_input *input = tx->inputs + i;
          need_size += input->script_len + 10;
        }
        for (uint32_t i = 0; i < tx->num_outputs; ++i) {
          const struct wally_tx_output *output = tx->outputs + i;
          need_size += output->script_len + 10;
        }
        if (flags != 0) {
          for (uint32_t i = 0; i < tx->num_inputs; ++i) {
            const struct wally_tx_input *input = tx->inputs + i;
            size_t num_items = input->witness ? input->witness->num_items : 0;
            for (uint32_t j = 0; j < num_items; ++j) {
              const struct wally_tx_witness_item *stack;
              stack = input->witness->items + j;
              need_size += stack->witness_len + 10;
            }
            need_size += 10;
          }
        }

        Serializer builder(static_cast<uint32_t>(need_size));
        builder.AddDirectNumber(tx->version);
        if ((flags != 0) && (tx->num_inputs != 0)) {  // witness
          builder.AddDirectByte(0);                   // marker is 0
          builder.AddDirectByte(1);                   // flag is 1(witness)
        }

        builder.AddVariableInt(tx->num_inputs);
        for (uint32_t i = 0; i < tx->num_inputs; ++i) {
          const struct wally_tx_input *input = tx->inputs + i;
          builder.AddDirectBytes(input->txhash, sizeof(input->txhash));
          builder.AddDirectNumber(input->index);
          builder.AddVariableBuffer(
              input->script, static_cast<uint32_t>(input->script_len));
          builder.AddDirectNumber(input->sequence);
        }

        builder.AddVariableInt(tx->num_outputs);
        for (uint32_t i = 0; i < tx->num_outputs; ++i) {
          const struct wally_tx_output *output = tx->outputs + i;
          builder.AddDirectNumber(output->satoshi);
          builder.AddVariableBuffer(
              output->script, static_cast<uint32_t>(output->script_len));
        }

        if (flags != 0) {  // witness
          for (uint32_t i = 0; i < tx->num_inputs; ++i) {
            const struct wally_tx_input *input = tx->inputs + i;
            uint32_t num_items =
                input->witness
                    ? static_cast<uint32_t>(input->witness->num_items)
                    : 0;
            builder.AddVariableInt(num_items);
            for (uint32_t j = 0; j < num_items; ++j) {
              const struct wally_tx_witness_item *stack;
              stack = input->witness->items + j;
              builder.AddVariableBuffer(
                  stack->witness, static_cast<uint32_t>(stack->witness_len));
            }
          }
        }

        builder.AddDirectNumber(tx->locktime);
        return builder.Output();
      } else {
        warn(CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}].", ret);
        throw CfdException(kCfdIllegalStateError, "tx hex convert error.");
      }
    } else {
      warn(CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}].", ret);
      throw CfdException(kCfdIllegalStateError, "psbt tx hex convert error.");
    }
  } catch (const CfdError &except) {
    throw except;
  } catch (const std::exception &except) {
    warn(CFD_LOG_SOURCE, "unknown exception.");
    throw CfdException(kCfdUnknownError, std::string(except.what()));
  } catch (...) {
    warn(CFD_LOG_SOURCE, "unknown error.");
    throw CfdException();
  }
}